

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KaxCuesData.cpp
# Opt level: O1

void __thiscall
libmatroska::KaxCuePoint::PositionSet
          (KaxCuePoint *this,KaxBlockBlob *BlobReference,uint64 GlobalTimecodeScale)

{
  KaxInternalBlock *this_00;
  EbmlElement *pEVar1;
  EbmlMaster *this_01;
  _func_int **pp_Var2;
  KaxBlockGroup *this_02;
  EbmlElement *pEVar3;
  
  this_00 = KaxBlockBlob::operator_cast_to_KaxInternalBlock_(BlobReference);
  pEVar1 = libebml::EbmlMaster::FindFirstElt
                     (&this->super_EbmlMaster,(EbmlCallbacks *)KaxCueTime::ClassInfos,true);
  pEVar1[1]._vptr_EbmlElement = (_func_int **)(this_00->Timecode / GlobalTimecodeScale);
  pEVar1->bValueIsSet = true;
  this_01 = (EbmlMaster *)
            libebml::EbmlMaster::AddNewElt
                      (&this->super_EbmlMaster,(EbmlCallbacks *)KaxCueTrackPositions::ClassInfos);
  pEVar1 = libebml::EbmlMaster::FindFirstElt(this_01,(EbmlCallbacks *)KaxCueTrack::ClassInfos,true);
  pEVar1[1]._vptr_EbmlElement = (_func_int **)(ulong)this_00->TrackNumber;
  pEVar1->bValueIsSet = true;
  pEVar1 = libebml::EbmlMaster::FindFirstElt
                     (this_01,(EbmlCallbacks *)KaxCueClusterPosition::ClassInfos,true);
  pp_Var2 = (_func_int **)KaxInternalBlock::ClusterPosition(this_00);
  pEVar1[1]._vptr_EbmlElement = pp_Var2;
  pEVar1->bValueIsSet = true;
  if (BlobReference->bUseSimpleBlock == false) {
    this_02 = KaxBlockBlob::operator_cast_to_KaxBlockGroup_(BlobReference);
    pEVar1 = libebml::EbmlMaster::FindFirstElt
                       (&this_02->super_EbmlMaster,(EbmlCallbacks *)KaxCodecState::ClassInfos);
    if (pEVar1 != (EbmlElement *)0x0) {
      pEVar3 = libebml::EbmlMaster::AddNewElt(this_01,(EbmlCallbacks *)KaxCueCodecState::ClassInfos)
      ;
      pp_Var2 = (_func_int **)
                KaxSegment::GetRelativePosition
                          (this_02->ParentCluster->ParentSegment,pEVar1->ElementPosition);
      pEVar3[1]._vptr_EbmlElement = pp_Var2;
      pEVar3->bValueIsSet = true;
    }
  }
  (this->super_EbmlMaster).super_EbmlElement.bValueIsSet = true;
  return;
}

Assistant:

void KaxCuePoint::PositionSet(const KaxBlockBlob & BlobReference, uint64 GlobalTimecodeScale)
{
  const KaxInternalBlock &BlockReference = BlobReference;

  // fill me
  KaxCueTime & NewTime = GetChild<KaxCueTime>(*this);
  *static_cast<EbmlUInteger*>(&NewTime) = BlockReference.GlobalTimecode() / GlobalTimecodeScale;

  KaxCueTrackPositions & NewPositions = AddNewChild<KaxCueTrackPositions>(*this);
  KaxCueTrack & TheTrack = GetChild<KaxCueTrack>(NewPositions);
  *static_cast<EbmlUInteger*>(&TheTrack) = BlockReference.TrackNum();

  KaxCueClusterPosition & TheClustPos = GetChild<KaxCueClusterPosition>(NewPositions);
  *static_cast<EbmlUInteger*>(&TheClustPos) = BlockReference.ClusterPosition();

#if 0 // MATROSKA_VERSION >= 2
  // handle reference use
  if (BlockReference.ReferenceCount() != 0) {
    unsigned int i;
    for (i=0; i<BlockReference.ReferenceCount(); i++) {
      KaxCueReference & NewRefs = AddNewChild<KaxCueReference>(NewPositions);
      NewRefs.AddReference(BlockReference.Reference(i).RefBlock(), GlobalTimecodeScale);
    }
  }
#endif // MATROSKA_VERSION

#if MATROSKA_VERSION >= 2
  if (!BlobReference.IsSimpleBlock()) {
    const KaxBlockGroup &BlockGroup = BlobReference;
    const KaxCodecState *CodecState = static_cast<KaxCodecState *>(BlockGroup.FindFirstElt(EBML_INFO(KaxCodecState)));
    if (CodecState != NULL) {
      KaxCueCodecState &CueCodecState = AddNewChild<KaxCueCodecState>(NewPositions);
      *static_cast<EbmlUInteger*>(&CueCodecState) = BlockGroup.GetParentCluster()->GetParentSegment()->GetRelativePosition(CodecState->GetElementPosition());
    }
  }
#endif // MATROSKA_VERSION

  SetValueIsSet();
}